

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall FIX::SocketMonitor::unsignal(SocketMonitor *this,socket_handle s)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  iterator i;
  socket_handle s_local;
  SocketMonitor *this_local;
  
  i._M_node._4_4_ = s;
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&this->m_writeSockets,(key_type *)((long)&i._M_node + 4));
  local_28._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_writeSockets);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (&this->m_writeSockets,(key_type *)((long)&i._M_node + 4));
  }
  return;
}

Assistant:

void SocketMonitor::unsignal(socket_handle s) {
  Sockets::iterator i = m_writeSockets.find(s);
  if (i == m_writeSockets.end()) {
    return;
  }

  m_writeSockets.erase(s);
}